

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_nex.cpp
# Opt level: O0

int __thiscall SNexHeader::init(SNexHeader *this,EVP_PKEY_CTX *ctx)

{
  SNexHeader *this_local;
  
  memset(this,0,0x200);
  builtin_memcpy(this->magicAndVersion,"NextV1.2",8);
  this->coreVersion[0] = '\x02';
  this->coreVersion[1] = '\0';
  this->coreVersion[2] = '\x1c';
  return (int)this;
}

Assistant:

void SNexHeader::init() {
	memset(magicAndVersion, 0, sizeof(SNexHeader));	// clear whole 512 bytes
	// set "magic" number and file version
	memcpy(magicAndVersion, "NextV1.2", 8);			// setup "magic" number at beginning
	// required core version is by default 2.00.28 (latest released)
	coreVersion[0] = 2;
	coreVersion[1] = 0;
	coreVersion[2] = 28;
}